

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O3

string_t __thiscall
duckdb::CaseConvertOperatorASCII<false>::Operation<duckdb::string_t,duckdb::string_t>
          (CaseConvertOperatorASCII<false> *this,string_t input,Vector *result)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  idx_t output_length;
  string_t sVar5;
  undefined1 local_38 [16];
  undefined8 local_28;
  long local_20;
  
  local_20 = input.value._0_8_;
  lVar4 = local_20;
  if ((uint)this < 0xd) {
    lVar4 = (long)&local_28 + 4;
  }
  local_28 = this;
  local_38 = (undefined1  [16])
             StringVector::EmptyString
                       (input.value._8_8_,(Vector *)((ulong)this & 0xffffffff),
                        (idx_t)input.value._8_8_);
  uVar1 = local_38._0_8_;
  pcVar3 = (char *)local_38._8_8_;
  if ((uint)local_38._0_4_ < 0xd) {
    pcVar3 = local_38 + 4;
  }
  if ((uint)this != 0) {
    lVar2 = 0;
    do {
      pcVar3[lVar2] = StringUtil::ASCII_TO_LOWER_MAP[*(byte *)(lVar2 + lVar4)];
      lVar2 = lVar2 + 1;
    } while ((Vector *)((ulong)this & 0xffffffff) != (Vector *)lVar2);
    uVar1 = (ulong)(uint)local_38._0_4_;
  }
  if ((uint)uVar1 < 0xd) {
    switchD_01043a80::default(local_38 + 4 + (uVar1 & 0xffffffff),0,0xc - (uVar1 & 0xffffffff));
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  sVar5.value.pointer.ptr = (char *)local_38._8_8_;
  sVar5.value._0_8_ = local_38._0_8_;
  return (string_t)sVar5.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return ASCIICaseConvert<IS_UPPER>(result, input_data, input_length);
	}